

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O0

void spvtools::CFA<spvtools::val::BasicBlock>::ComputeAugmentedCFG
               (vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                *ordered_blocks,BasicBlock *pseudo_entry_block,BasicBlock *pseudo_exit_block,
               unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
               *augmented_successors_map,
               unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
               *augmented_predecessors_map,get_blocks_func *succ_func,get_blocks_func *pred_func)

{
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar1;
  bool bVar2;
  mapped_type *pmVar3;
  reference ppBVar4;
  size_type sVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  local_1b0;
  const_iterator local_1a8;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *local_1a0;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *succ;
  mapped_type *augmented_succ;
  BasicBlock *block_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range2_1;
  __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  local_158;
  const_iterator local_150;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *local_148;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *preds;
  mapped_type *augmented_preds;
  BasicBlock *block;
  iterator __end0;
  iterator __begin0;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range2;
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  local_f8;
  undefined1 local_d8 [8];
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> sinks;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> reversed_blocks;
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  local_70;
  undefined1 local_50 [8];
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> sources;
  get_blocks_func *succ_func_local;
  unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
  *augmented_predecessors_map_local;
  unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
  *augmented_successors_map_local;
  BasicBlock *pseudo_exit_block_local;
  BasicBlock *pseudo_entry_block_local;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
  *ordered_blocks_local;
  
  sources.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)succ_func;
  augmented_successors_map_local =
       (unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
        *)pseudo_exit_block;
  pseudo_exit_block_local = pseudo_entry_block;
  pseudo_entry_block_local = (BasicBlock *)ordered_blocks;
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::function(&local_70,succ_func);
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::function((function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
              *)&reversed_blocks.
                 super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pred_func);
  TraversalRoots((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  *)local_50,ordered_blocks,&local_70,
                 (get_blocks_func *)
                 &reversed_blocks.
                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::~function((function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
               *)&reversed_blocks.
                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::~function(&local_70);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::rbegin
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             (local_b8 + 8));
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::rend
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             local_b8);
  std::allocator<spvtools::val::BasicBlock_*>::allocator
            ((allocator<spvtools::val::BasicBlock_*> *)
             ((long)&sinks.
                     super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock**,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>>,void>
            ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
             local_a8,(reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>
                       *)(local_b8 + 8),
             (reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>
              *)local_b8,
             (allocator_type *)
             ((long)&sinks.
                     super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<spvtools::val::BasicBlock_*>::~allocator
            ((allocator<spvtools::val::BasicBlock_*> *)
             ((long)&sinks.
                     super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::function(&local_f8,pred_func);
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::function((function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
              *)&__range2,succ_func);
  TraversalRoots((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  *)local_d8,
                 (vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  *)local_a8,&local_f8,(get_blocks_func *)&__range2);
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::~function((function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
               *)&__range2);
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::~function(&local_f8);
  pmVar3 = std::
           unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
           ::operator[](augmented_successors_map,&pseudo_exit_block_local);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::operator=
            (pmVar3,(vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     *)local_50);
  __end0 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
           begin((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  *)local_50);
  block = (BasicBlock *)
          std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
          end((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
              local_50);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                *)&block);
    if (!bVar2) break;
    ppBVar4 = __gnu_cxx::
              __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
              ::operator*(&__end0);
    augmented_preds = (mapped_type *)*ppBVar4;
    preds = std::
            unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
            ::operator[](augmented_predecessors_map,(key_type *)&augmented_preds);
    local_148 = std::
                function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
                ::operator()(pred_func,(BasicBlock *)augmented_preds);
    pvVar1 = preds;
    sVar5 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
            size(local_148);
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::reserve
              (pvVar1,sVar5 + 1);
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
    push_back(preds,&pseudo_exit_block_local);
    pvVar1 = preds;
    local_158._M_current =
         (BasicBlock **)
         std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::end
                   (preds);
    __gnu_cxx::
    __normal_iterator<spvtools::val::BasicBlock*const*,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>
    ::__normal_iterator<spvtools::val::BasicBlock**>
              ((__normal_iterator<spvtools::val::BasicBlock*const*,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>
                *)&local_150,&local_158);
    cVar6 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
            begin(local_148);
    cVar7 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
            end(local_148);
    std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
    insert<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock*const*,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>,void>
              ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
               pvVar1,local_150,
               (__normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                )cVar6._M_current,
               (__normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                )cVar7._M_current);
    __gnu_cxx::
    __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
    ::operator++(&__end0);
  }
  pmVar3 = std::
           unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
           ::operator[](augmented_predecessors_map,(key_type *)&augmented_successors_map_local);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::operator=
            (pmVar3,(vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     *)local_d8);
  __end0_1 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ::begin((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                      *)local_d8);
  block_1 = (BasicBlock *)
            std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
            end((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *
                )local_d8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0_1,
                       (__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                        *)&block_1);
    if (!bVar2) break;
    ppBVar4 = __gnu_cxx::
              __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
              ::operator*(&__end0_1);
    augmented_succ = (mapped_type *)*ppBVar4;
    succ = std::
           unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
           ::operator[](augmented_successors_map,(key_type *)&augmented_succ);
    local_1a0 = std::
                function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
                ::operator()(succ_func,(BasicBlock *)augmented_succ);
    pvVar1 = succ;
    sVar5 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
            size(local_1a0);
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::reserve
              (pvVar1,sVar5 + 1);
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
    push_back(succ,(value_type *)&augmented_successors_map_local);
    pvVar1 = succ;
    local_1b0._M_current =
         (BasicBlock **)
         std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::end
                   (succ);
    __gnu_cxx::
    __normal_iterator<spvtools::val::BasicBlock*const*,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>
    ::__normal_iterator<spvtools::val::BasicBlock**>
              ((__normal_iterator<spvtools::val::BasicBlock*const*,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>
                *)&local_1a8,&local_1b0);
    cVar6 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
            begin(local_1a0);
    cVar7 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
            end(local_1a0);
    std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
    insert<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock*const*,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>,void>
              ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
               pvVar1,local_1a8,
               (__normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                )cVar6._M_current,
               (__normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                )cVar7._M_current);
    __gnu_cxx::
    __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
    ::operator++(&__end0_1);
  }
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::~vector
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             local_d8);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::~vector
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             local_a8);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::~vector
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             local_50);
  return;
}

Assistant:

void CFA<BB>::ComputeAugmentedCFG(
    std::vector<BB*>& ordered_blocks, BB* pseudo_entry_block,
    BB* pseudo_exit_block,
    std::unordered_map<const BB*, std::vector<BB*>>* augmented_successors_map,
    std::unordered_map<const BB*, std::vector<BB*>>* augmented_predecessors_map,
    get_blocks_func succ_func, get_blocks_func pred_func) {
  // Compute the successors of the pseudo-entry block, and
  // the predecessors of the pseudo exit block.
  auto sources = TraversalRoots(ordered_blocks, succ_func, pred_func);

  // For the predecessor traversals, reverse the order of blocks.  This
  // will affect the post-dominance calculation as follows:
  //  - Suppose you have blocks A and B, with A appearing before B in
  //    the list of blocks.
  //  - Also, A branches only to B, and B branches only to A.
  //  - We want to compute A as dominating B, and B as post-dominating B.
  // By using reversed blocks for predecessor traversal roots discovery,
  // we'll add an edge from B to the pseudo-exit node, rather than from A.
  // All this is needed to correctly process the dominance/post-dominance
  // constraint when A is a loop header that points to itself as its
  // own continue target, and B is the latch block for the loop.
  std::vector<BB*> reversed_blocks(ordered_blocks.rbegin(),
                                   ordered_blocks.rend());
  auto sinks = TraversalRoots(reversed_blocks, pred_func, succ_func);

  // Wire up the pseudo entry block.
  (*augmented_successors_map)[pseudo_entry_block] = sources;
  for (auto block : sources) {
    auto& augmented_preds = (*augmented_predecessors_map)[block];
    const auto preds = pred_func(block);
    augmented_preds.reserve(1 + preds->size());
    augmented_preds.push_back(pseudo_entry_block);
    augmented_preds.insert(augmented_preds.end(), preds->begin(), preds->end());
  }

  // Wire up the pseudo exit block.
  (*augmented_predecessors_map)[pseudo_exit_block] = sinks;
  for (auto block : sinks) {
    auto& augmented_succ = (*augmented_successors_map)[block];
    const auto succ = succ_func(block);
    augmented_succ.reserve(1 + succ->size());
    augmented_succ.push_back(pseudo_exit_block);
    augmented_succ.insert(augmented_succ.end(), succ->begin(), succ->end());
  }
}